

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O1

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,Field a,Field b)

{
  bool bVar1;
  Comparison CVar2;
  PackedType PVar3;
  PackedType PVar4;
  
  if (a._8_8_ >> 0x20 == b._8_8_ >> 0x20) {
    PVar3 = a.packedType;
    if ((a.type.id.id != 2 && PVar3 != not_packed) ||
       (PVar4 = b.packedType, b.type.id.id != 2 && PVar4 != not_packed)) {
      __assert_fail("type == Type::i32 && \"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x28a,"bool wasm::Field::isPacked() const");
    }
    if ((PVar3 != not_packed) != (PVar4 != not_packed)) {
      return GT - (PVar3 != not_packed && PVar4 == not_packed);
    }
    if (PVar3 == PVar4) {
      CVar2 = compare(this,a.type.id,b.type.id);
      return CVar2;
    }
    bVar1 = (int)PVar4 <= (int)PVar3;
  }
  else {
    bVar1 = (int)b.mutable_ <= (int)a.mutable_;
  }
  return bVar1 + LT;
}

Assistant:

Comparison compare(Field a, Field b) {
    if (a.mutable_ != b.mutable_) {
      return a.mutable_ < b.mutable_ ? LT : GT;
    }
    if (a.isPacked() != b.isPacked()) {
      return b.isPacked() < a.isPacked() ? LT : GT;
    }
    if (a.packedType != b.packedType) {
      return a.packedType < b.packedType ? LT : GT;
    }
    return compare(a.type, b.type);
  }